

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_lazy_message_field_lite.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::java::RepeatedImmutableLazyMessageFieldLiteGenerator::
GenerateParsingCode(RepeatedImmutableLazyMessageFieldLiteGenerator *this,Printer *printer)

{
  io::Printer::Print(printer,&(this->super_RepeatedImmutableMessageFieldLiteGenerator).variables_,
                     "if (!$is_mutable$) {\n  $name$_ =\n      com.google.protobuf.GeneratedMessageLite.mutableCopy($name$_);\n}\n$name$_.add(new com.google.protobuf.LazyFieldLite(\n    extensionRegistry, input.readBytes()));\n"
                    );
  return;
}

Assistant:

void RepeatedImmutableLazyMessageFieldLiteGenerator::
GenerateParsingCode(io::Printer* printer) const {
  printer->Print(variables_,
    "if (!$is_mutable$) {\n"
    "  $name$_ =\n"
    "      com.google.protobuf.GeneratedMessageLite.mutableCopy($name$_);\n"
    "}\n"
    "$name$_.add(new com.google.protobuf.LazyFieldLite(\n"
    "    extensionRegistry, input.readBytes()));\n");
}